

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O3

el_status_t move_to_char(void)

{
  int iVar1;
  el_status_t eVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  
  iVar1 = tty_get();
  if (iVar1 == -1) {
    eVar2 = CSeof;
  }
  else {
    uVar4 = (long)rl_point + 1;
    eVar2 = CSstay;
    if ((int)uVar4 < rl_end) {
      pcVar5 = rl_line_buffer + uVar4;
      do {
        if (iVar1 == *pcVar5) {
          rl_point = (int)uVar4;
          return CSmove;
        }
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        pcVar5 = pcVar5 + 1;
      } while (rl_end != uVar3);
    }
  }
  return eVar2;
}

Assistant:

static el_status_t move_to_char(void)
{
    int i, c;
    char *p;

    if ((c = tty_get()) == EOF)
        return CSeof;

    for (i = rl_point + 1, p = &rl_line_buffer[i]; i < rl_end; i++, p++) {
        if (*p == c) {
            rl_point = i;
            return CSmove;
        }
    }

    return CSstay;
}